

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  U32 UVar2;
  uint uVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  U32 UVar10;
  U32 UVar11;
  U32 UVar12;
  uint uVar13;
  U32 UVar14;
  uint uVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  U64 UVar19;
  U64 UVar20;
  size_t sVar21;
  size_t sVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  ulong uVar25;
  bool bVar26;
  uint local_1e84;
  uint local_1e80;
  uint local_1cbc;
  uint local_1cb8;
  uint local_1af4;
  uint local_1af0;
  uint local_192c;
  uint local_1928;
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff_3;
  size_t rLength_3;
  U32 tmpOffset_3;
  size_t repLength2_3;
  BYTE *repEnd2_3;
  BYTE *repMatch2_3;
  U32 repIndex2_3;
  U32 current2_3;
  U32 indexToInsert_3;
  BYTE *dictMatchL3_3;
  BYTE *pBStack_16d8;
  U32 dictMatchIndexL3_3;
  BYTE *matchL3_3;
  U32 matchIndexL3_3;
  size_t dictHLNext_3;
  size_t hl3_3;
  U32 dictMatchIndexS_3;
  BYTE *dictMatchL_3;
  U32 dictMatchIndexL_3;
  BYTE *repMatchEnd_3;
  BYTE *repMatch_3;
  BYTE *pBStack_1688;
  U32 repIndex_3;
  BYTE *match_3;
  BYTE *matchLong_3;
  U32 matchIndexS_3;
  U32 matchIndexL_3;
  U32 curr_7;
  size_t dictHS_3;
  size_t dictHL_3;
  size_t h_3;
  size_t h2_3;
  long lStack_1640;
  U32 offset_5;
  size_t mLength_3;
  U32 maxRep_3;
  U32 windowLow_3;
  U32 curr_6;
  U32 dictAndPrefixLength_3;
  U32 dictHBitsS_3;
  U32 dictHBitsL_3;
  U32 dictIndexDelta_3;
  BYTE *dictEnd_3;
  BYTE *dictStart_3;
  BYTE *dictBase_3;
  U32 dictStartIndex_3;
  U32 *dictHashSmall_3;
  U32 *dictHashLong_3;
  ZSTD_compressionParameters *dictCParams_3;
  ZSTD_matchState_t *dms_3;
  uint local_15d0;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixLowest_3;
  U32 prefixLowestIndex_3;
  U32 endIndex_3;
  BYTE *anchor_3;
  BYTE *ip_18;
  BYTE *istart_3;
  BYTE *base_3;
  U32 hBitsS_3;
  U32 *hashSmall_3;
  U32 hBitsL_3;
  U32 *hashLong_3;
  ZSTD_compressionParameters *cParams_3;
  size_t local_1508;
  size_t local_14c0;
  size_t local_14a8;
  size_t local_1400;
  U32 tmpOff_2;
  size_t rLength_2;
  U32 tmpOffset_2;
  size_t repLength2_2;
  BYTE *repEnd2_2;
  BYTE *repMatch2_2;
  U32 repIndex2_2;
  U32 current2_2;
  U32 indexToInsert_2;
  BYTE *dictMatchL3_2;
  BYTE *pBStack_1390;
  U32 dictMatchIndexL3_2;
  BYTE *matchL3_2;
  U32 matchIndexL3_2;
  size_t dictHLNext_2;
  size_t hl3_2;
  U32 dictMatchIndexS_2;
  BYTE *dictMatchL_2;
  U32 dictMatchIndexL_2;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  BYTE *pBStack_1340;
  U32 repIndex_2;
  BYTE *match_2;
  BYTE *matchLong_2;
  U32 matchIndexS_2;
  U32 matchIndexL_2;
  U32 curr_5;
  size_t dictHS_2;
  size_t dictHL_2;
  size_t h_2;
  size_t h2_2;
  long lStack_12f8;
  U32 offset_4;
  size_t mLength_2;
  U32 maxRep_2;
  U32 windowLow_2;
  U32 curr_4;
  U32 dictAndPrefixLength_2;
  U32 dictHBitsS_2;
  U32 dictHBitsL_2;
  U32 dictIndexDelta_2;
  BYTE *dictEnd_2;
  BYTE *dictStart_2;
  BYTE *dictBase_2;
  U32 dictStartIndex_2;
  U32 *dictHashSmall_2;
  U32 *dictHashLong_2;
  ZSTD_compressionParameters *dictCParams_2;
  ZSTD_matchState_t *dms_2;
  uint local_1288;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixLowest_2;
  U32 prefixLowestIndex_2;
  U32 endIndex_2;
  BYTE *anchor_2;
  BYTE *ip_12;
  BYTE *istart_2;
  BYTE *base_2;
  U32 hBitsS_2;
  U32 *hashSmall_2;
  U32 hBitsL_2;
  U32 *hashLong_2;
  ZSTD_compressionParameters *cParams_2;
  size_t local_11c0;
  size_t local_1178;
  size_t local_1160;
  size_t local_10b8;
  U32 tmpOff_1;
  size_t rLength_1;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  U32 indexToInsert_1;
  BYTE *dictMatchL3_1;
  BYTE *pBStack_1048;
  U32 dictMatchIndexL3_1;
  BYTE *matchL3_1;
  U32 matchIndexL3_1;
  size_t dictHLNext_1;
  size_t hl3_1;
  U32 dictMatchIndexS_1;
  BYTE *dictMatchL_1;
  U32 dictMatchIndexL_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  BYTE *pBStack_ff8;
  U32 repIndex_1;
  BYTE *match_1;
  BYTE *matchLong_1;
  U32 matchIndexS_1;
  U32 matchIndexL_1;
  U32 curr_3;
  size_t dictHS_1;
  size_t dictHL_1;
  size_t h_1;
  size_t h2_1;
  long lStack_fb0;
  U32 offset_3;
  size_t mLength_1;
  U32 maxRep_1;
  U32 windowLow_1;
  U32 curr_2;
  U32 dictAndPrefixLength_1;
  U32 dictHBitsS_1;
  U32 dictHBitsL_1;
  U32 dictIndexDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashSmall_1;
  U32 *dictHashLong_1;
  ZSTD_compressionParameters *dictCParams_1;
  ZSTD_matchState_t *dms_1;
  uint local_f40;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixLowest_1;
  U32 prefixLowestIndex_1;
  U32 endIndex_1;
  BYTE *anchor_1;
  BYTE *ip_6;
  BYTE *istart_1;
  BYTE *base_1;
  U32 hBitsS_1;
  U32 *hashSmall_1;
  U32 hBitsL_1;
  U32 *hashLong_1;
  ZSTD_compressionParameters *cParams_1;
  size_t local_e78;
  size_t local_e30;
  size_t local_e18;
  size_t local_d70;
  U32 tmpOff;
  size_t rLength;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 indexToInsert;
  BYTE *dictMatchL3;
  BYTE *pBStack_d00;
  U32 dictMatchIndexL3;
  BYTE *matchL3;
  U32 matchIndexL3;
  size_t dictHLNext;
  size_t hl3;
  U32 dictMatchIndexS;
  BYTE *dictMatchL;
  U32 dictMatchIndexL;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_cb0;
  U32 repIndex;
  BYTE *match;
  BYTE *matchLong;
  U32 matchIndexS;
  U32 matchIndexL;
  U32 curr_1;
  size_t dictHS;
  size_t dictHL;
  size_t h;
  size_t h2;
  long lStack_c68;
  U32 offset;
  size_t mLength;
  U32 maxRep;
  U32 windowLow;
  U32 curr;
  U32 dictAndPrefixLength;
  U32 dictHBitsS;
  U32 dictHBitsL;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashSmall;
  U32 *dictHashLong;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  uint local_bf8;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  U32 endIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  size_t local_b30;
  size_t local_ae8;
  size_t local_ad0;
  size_t local_a28;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd_5;
  BYTE *litLimit_w_5;
  BYTE *litEnd_6;
  BYTE *litLimit_w_6;
  BYTE *litEnd_8;
  BYTE *litLimit_w_8;
  BYTE *litEnd_9;
  BYTE *litLimit_w_9;
  BYTE *litEnd_7;
  BYTE *litLimit_w_7;
  BYTE *litEnd_10;
  BYTE *litLimit_w_10;
  BYTE *litEnd_11;
  BYTE *litLimit_w_11;
  BYTE *litEnd_13;
  BYTE *litLimit_w_13;
  BYTE *litEnd_14;
  BYTE *litLimit_w_14;
  BYTE *litEnd_12;
  BYTE *litLimit_w_12;
  BYTE *litEnd_15;
  BYTE *litLimit_w_15;
  BYTE *litEnd_16;
  BYTE *litLimit_w_16;
  BYTE *litEnd_18;
  BYTE *litLimit_w_18;
  BYTE *litEnd_19;
  BYTE *litLimit_w_19;
  BYTE *litEnd_17;
  BYTE *litLimit_w_17;
  BYTE *oend_17;
  BYTE *op_17;
  BYTE *ip_21;
  ptrdiff_t diff_17;
  BYTE *oend_19;
  BYTE *op_19;
  BYTE *ip_23;
  ptrdiff_t diff_19;
  BYTE *oend_18;
  BYTE *op_18;
  BYTE *ip_22;
  ptrdiff_t diff_18;
  BYTE *oend_16;
  BYTE *op_16;
  BYTE *ip_20;
  ptrdiff_t diff_16;
  BYTE *oend_15;
  BYTE *op_15;
  BYTE *ip_19;
  ptrdiff_t diff_15;
  BYTE *oend_12;
  BYTE *op_12;
  BYTE *ip_15;
  ptrdiff_t diff_12;
  BYTE *oend_14;
  BYTE *op_14;
  BYTE *ip_17;
  ptrdiff_t diff_14;
  BYTE *oend_13;
  BYTE *op_13;
  BYTE *ip_16;
  ptrdiff_t diff_13;
  BYTE *oend_11;
  BYTE *op_11;
  BYTE *ip_14;
  ptrdiff_t diff_11;
  BYTE *oend_10;
  BYTE *op_10;
  BYTE *ip_13;
  ptrdiff_t diff_10;
  BYTE *oend_7;
  BYTE *op_7;
  BYTE *ip_9;
  ptrdiff_t diff_7;
  BYTE *oend_9;
  BYTE *op_9;
  BYTE *ip_11;
  ptrdiff_t diff_9;
  BYTE *oend_8;
  BYTE *op_8;
  BYTE *ip_10;
  ptrdiff_t diff_8;
  BYTE *oend_6;
  BYTE *op_6;
  BYTE *ip_8;
  ptrdiff_t diff_6;
  BYTE *oend_5;
  BYTE *op_5;
  BYTE *ip_7;
  ptrdiff_t diff_5;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_5;
  ptrdiff_t diff_4;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_4;
  ptrdiff_t diff_3;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  iVar9 = (int)srcSize;
  iVar7 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar5 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar6 = (ms->window).base;
    iVar8 = (int)pBVar6;
    UVar10 = ZSTD_getLowestPrefixIndex(ms,(iVar7 - iVar8) + iVar9,(ms->cParams).windowLog);
    pBVar16 = pBVar6 + UVar10;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar15 = *rep;
    uVar3 = rep[1];
    dms._4_4_ = 0;
    anchor = (BYTE *)((long)src + (long)(int)(uint)(iVar7 == (int)pBVar16));
    UVar11 = (int)anchor - iVar8;
    UVar12 = ZSTD_getLowestPrefixIndex(ms,UVar11,(ms->cParams).windowLog);
    uVar13 = UVar11 - UVar12;
    local_bf8 = uVar3;
    if (uVar13 < uVar3) {
      local_bf8 = 0;
      dms._4_4_ = uVar3;
    }
    offsetSaved = uVar15;
    _prefixLowestIndex = (BYTE *)src;
    if (uVar13 < uVar15) {
      offsetSaved = 0;
      dms._4_4_ = uVar15;
    }
    while (anchor < pBVar18) {
      sVar21 = ZSTD_hash8Ptr(anchor,UVar1);
      switch(0x250c03) {
      case 0:
        local_a28 = ZSTD_hash4Ptr(anchor,UVar2);
        break;
      case 1:
        local_a28 = ZSTD_hash5Ptr(anchor,UVar2);
        break;
      case 2:
        local_a28 = ZSTD_hash6Ptr(anchor,UVar2);
        break;
      case 3:
        local_a28 = ZSTD_hash7Ptr(anchor,UVar2);
        break;
      case 4:
        local_a28 = ZSTD_hash8Ptr(anchor,UVar2);
      }
      ZSTD_hash8Ptr(anchor,UVar1);
      switch(0x250dd3) {
      case 0:
        ZSTD_hash4Ptr(anchor,UVar2);
        break;
      case 1:
        ZSTD_hash5Ptr(anchor,UVar2);
        break;
      case 2:
        ZSTD_hash6Ptr(anchor,UVar2);
        break;
      case 3:
        ZSTD_hash7Ptr(anchor,UVar2);
        break;
      case 4:
        ZSTD_hash8Ptr(anchor,UVar2);
      }
      iVar9 = (int)anchor;
      UVar11 = iVar9 - iVar8;
      uVar15 = pUVar4[sVar21];
      uVar3 = pUVar5[local_a28];
      match = pBVar6 + uVar15;
      pBStack_cb0 = pBVar6 + uVar3;
      pUVar5[local_a28] = UVar11;
      pUVar4[sVar21] = UVar11;
      UVar12 = MEM_read32(anchor + (1 - (ulong)offsetSaved));
      UVar14 = MEM_read32(anchor + 1);
      if (offsetSaved == 0 || UVar12 != UVar14) {
        if (UVar10 < uVar15) {
          UVar19 = MEM_read64(match);
          UVar20 = MEM_read64(anchor);
          if (UVar19 != UVar20) goto LAB_002519ff;
          sVar21 = ZSTD_count(anchor + 8,match + 8,pBVar17);
          lStack_c68 = sVar21 + 8;
          h2._4_4_ = iVar9 - (int)match;
          while( true ) {
            bVar26 = false;
            if (_prefixLowestIndex < anchor && pBVar16 < match) {
              bVar26 = anchor[-1] == match[-1];
            }
            if (!bVar26) break;
            anchor = anchor + -1;
            match = match + -1;
            lStack_c68 = lStack_c68 + 1;
          }
LAB_002521f9:
          local_bf8 = offsetSaved;
          offsetSaved = h2._4_4_;
          uVar25 = (long)anchor - (long)_prefixLowestIndex;
          if (pBVar17 + -0x20 < _prefixLowestIndex + uVar25) {
            ZSTD_safecopyLiterals
                      (seqStore->lit,_prefixLowestIndex,_prefixLowestIndex + uVar25,pBVar17 + -0x20)
            ;
          }
          else {
            ZSTD_copy16(seqStore->lit,_prefixLowestIndex);
            if (0x10 < uVar25) {
              pBVar24 = seqStore->lit;
              pBVar23 = pBVar24 + 0x10;
              ZSTD_copy16(pBVar23,_prefixLowestIndex + 0x10);
              if (0x10 < (long)(uVar25 - 0x10)) {
                oend_2 = pBVar24 + 0x20;
                do {
                  op_2 = _prefixLowestIndex + 0x20;
                  ZSTD_copy16(oend_2,op_2);
                  ZSTD_copy16(oend_2 + 0x10,_prefixLowestIndex + 0x30);
                  oend_2 = oend_2 + 0x20;
                  _prefixLowestIndex = op_2;
                } while (oend_2 < pBVar23 + (uVar25 - 0x10));
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar25;
          if (0xffff < uVar25) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar25;
          seqStore->sequences->offset = h2._4_4_ + 3;
          if (0xffff < lStack_c68 - 3U) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(lStack_c68 - 3U);
          seqStore->sequences = seqStore->sequences + 1;
          goto LAB_002525ac;
        }
LAB_002519ff:
        if (UVar10 < uVar3) {
          UVar12 = MEM_read32(pBStack_cb0);
          UVar14 = MEM_read32(anchor);
          if (UVar12 == UVar14) {
            sVar21 = ZSTD_hash8Ptr(anchor + 1,UVar1);
            ZSTD_hash8Ptr(anchor + 1,UVar1);
            uVar15 = pUVar4[sVar21];
            pBStack_d00 = pBVar6 + uVar15;
            pUVar4[sVar21] = UVar11 + 1;
            if (UVar10 < uVar15) {
              UVar19 = MEM_read64(pBStack_d00);
              UVar20 = MEM_read64(anchor + 1);
              if (UVar19 == UVar20) {
                sVar21 = ZSTD_count(anchor + 9,pBStack_d00 + 8,pBVar17);
                lStack_c68 = sVar21 + 8;
                anchor = anchor + 1;
                h2._4_4_ = (int)anchor - (int)pBStack_d00;
                while( true ) {
                  bVar26 = false;
                  if (_prefixLowestIndex < anchor && pBVar16 < pBStack_d00) {
                    bVar26 = anchor[-1] == pBStack_d00[-1];
                  }
                  if (!bVar26) break;
                  anchor = anchor + -1;
                  pBStack_d00 = pBStack_d00 + -1;
                  lStack_c68 = lStack_c68 + 1;
                }
                goto LAB_002521f9;
              }
            }
            sVar21 = ZSTD_count(anchor + 4,pBStack_cb0 + 4,pBVar17);
            lStack_c68 = sVar21 + 4;
            h2._4_4_ = iVar9 - (int)pBStack_cb0;
            while( true ) {
              bVar26 = false;
              if (_prefixLowestIndex < anchor && pBVar16 < pBStack_cb0) {
                bVar26 = anchor[-1] == pBStack_cb0[-1];
              }
              if (!bVar26) break;
              anchor = anchor + -1;
              pBStack_cb0 = pBStack_cb0 + -1;
              lStack_c68 = lStack_c68 + 1;
            }
            goto LAB_002521f9;
          }
        }
        anchor = anchor + ((long)anchor - (long)_prefixLowestIndex >> 8) + 1;
      }
      else {
        sVar21 = ZSTD_count(anchor + 5,anchor + (5 - (ulong)offsetSaved),pBVar17);
        lStack_c68 = sVar21 + 4;
        anchor = anchor + 1;
        uVar25 = (long)anchor - (long)_prefixLowestIndex;
        if (pBVar17 + -0x20 < _prefixLowestIndex + uVar25) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixLowestIndex,_prefixLowestIndex + uVar25,pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixLowestIndex);
          if (0x10 < uVar25) {
            pBVar24 = seqStore->lit;
            pBVar23 = pBVar24 + 0x10;
            ZSTD_copy16(pBVar23,_prefixLowestIndex + 0x10);
            if (0x10 < (long)(uVar25 - 0x10)) {
              oend_1 = pBVar24 + 0x20;
              do {
                op_1 = _prefixLowestIndex + 0x20;
                ZSTD_copy16(oend_1,op_1);
                ZSTD_copy16(oend_1 + 0x10,_prefixLowestIndex + 0x30);
                oend_1 = oend_1 + 0x20;
                _prefixLowestIndex = op_1;
              } while (oend_1 < pBVar23 + (uVar25 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar25;
        if (0xffff < uVar25) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar25;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar21 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar21 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_002525ac:
        _prefixLowestIndex = anchor + lStack_c68;
        anchor = _prefixLowestIndex;
        if (_prefixLowestIndex <= pBVar18) {
          uVar15 = UVar11 + 2;
          sVar21 = ZSTD_hash8Ptr(pBVar6 + uVar15,UVar1);
          pUVar4[sVar21] = uVar15;
          sVar21 = ZSTD_hash8Ptr(_prefixLowestIndex + -2,UVar1);
          pUVar4[sVar21] = (int)(_prefixLowestIndex + -2) - iVar8;
          pBVar24 = pBVar6 + uVar15;
          switch(0x252888) {
          case 0:
            local_ad0 = ZSTD_hash4Ptr(pBVar24,UVar2);
            break;
          case 1:
            local_ad0 = ZSTD_hash5Ptr(pBVar24,UVar2);
            break;
          case 2:
            local_ad0 = ZSTD_hash6Ptr(pBVar24,UVar2);
            break;
          case 3:
            local_ad0 = ZSTD_hash7Ptr(pBVar24,UVar2);
            break;
          case 4:
            local_ad0 = ZSTD_hash8Ptr(pBVar24,UVar2);
          }
          pUVar5[local_ad0] = uVar15;
          _prefixLowestIndex = _prefixLowestIndex + -1;
          switch(0x25299b) {
          case 0:
            local_ae8 = ZSTD_hash4Ptr(_prefixLowestIndex,UVar2);
            break;
          case 1:
            local_ae8 = ZSTD_hash5Ptr(_prefixLowestIndex,UVar2);
            break;
          case 2:
            local_ae8 = ZSTD_hash6Ptr(_prefixLowestIndex,UVar2);
            break;
          case 3:
            local_ae8 = ZSTD_hash7Ptr(_prefixLowestIndex,UVar2);
            break;
          case 4:
            local_ae8 = ZSTD_hash8Ptr(_prefixLowestIndex,UVar2);
          }
          pUVar5[local_ae8] = (int)_prefixLowestIndex - iVar8;
          while( true ) {
            uVar15 = local_bf8;
            bVar26 = false;
            if (anchor <= pBVar18) {
              UVar11 = MEM_read32(anchor);
              UVar12 = MEM_read32(anchor + -(ulong)local_bf8);
              bVar26 = local_bf8 != 0 && UVar11 == UVar12;
            }
            _prefixLowestIndex = anchor;
            if (!bVar26) break;
            sVar21 = ZSTD_count(anchor + 4,anchor + 4 + -(ulong)local_bf8,pBVar17);
            local_bf8 = offsetSaved;
            offsetSaved = uVar15;
            switch(0x2532f5) {
            case 0:
              local_b30 = ZSTD_hash4Ptr(anchor,UVar2);
              break;
            case 1:
              local_b30 = ZSTD_hash5Ptr(anchor,UVar2);
              break;
            case 2:
              local_b30 = ZSTD_hash6Ptr(anchor,UVar2);
              break;
            case 3:
              local_b30 = ZSTD_hash7Ptr(anchor,UVar2);
              break;
            case 4:
              local_b30 = ZSTD_hash8Ptr(anchor,UVar2);
            }
            pUVar5[local_b30] = (int)anchor - iVar8;
            sVar22 = ZSTD_hash8Ptr(anchor,UVar1);
            pUVar4[sVar22] = (int)anchor - iVar8;
            if (pBVar17 + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,pBVar17 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar21 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar21 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            anchor = anchor + sVar21 + 4;
          }
        }
      }
    }
    if (offsetSaved == 0) {
      local_1928 = dms._4_4_;
    }
    else {
      local_1928 = offsetSaved;
    }
    *rep = local_1928;
    if (local_bf8 == 0) {
      local_192c = dms._4_4_;
    }
    else {
      local_192c = local_bf8;
    }
    rep[1] = local_192c;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_prefixLowestIndex);
    break;
  case 5:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar5 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar6 = (ms->window).base;
    iVar8 = (int)pBVar6;
    UVar10 = ZSTD_getLowestPrefixIndex(ms,(iVar7 - iVar8) + iVar9,(ms->cParams).windowLog);
    pBVar16 = pBVar6 + UVar10;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar15 = *rep;
    uVar3 = rep[1];
    dms_1._4_4_ = 0;
    anchor_1 = (BYTE *)((long)src + (long)(int)(uint)(iVar7 == (int)pBVar16));
    UVar11 = (int)anchor_1 - iVar8;
    UVar12 = ZSTD_getLowestPrefixIndex(ms,UVar11,(ms->cParams).windowLog);
    uVar13 = UVar11 - UVar12;
    local_f40 = uVar3;
    if (uVar13 < uVar3) {
      local_f40 = 0;
      dms_1._4_4_ = uVar3;
    }
    offsetSaved_1 = uVar15;
    _prefixLowestIndex_1 = (BYTE *)src;
    if (uVar13 < uVar15) {
      offsetSaved_1 = 0;
      dms_1._4_4_ = uVar15;
    }
    while (anchor_1 < pBVar18) {
      sVar21 = ZSTD_hash8Ptr(anchor_1,UVar1);
      switch(0x253f18) {
      case 0:
        local_d70 = ZSTD_hash4Ptr(anchor_1,UVar2);
        break;
      case 1:
        local_d70 = ZSTD_hash5Ptr(anchor_1,UVar2);
        break;
      case 2:
        local_d70 = ZSTD_hash6Ptr(anchor_1,UVar2);
        break;
      case 3:
        local_d70 = ZSTD_hash7Ptr(anchor_1,UVar2);
        break;
      case 4:
        local_d70 = ZSTD_hash8Ptr(anchor_1,UVar2);
      }
      ZSTD_hash8Ptr(anchor_1,UVar1);
      switch(0x2540e8) {
      case 0:
        ZSTD_hash4Ptr(anchor_1,UVar2);
        break;
      case 1:
        ZSTD_hash5Ptr(anchor_1,UVar2);
        break;
      case 2:
        ZSTD_hash6Ptr(anchor_1,UVar2);
        break;
      case 3:
        ZSTD_hash7Ptr(anchor_1,UVar2);
        break;
      case 4:
        ZSTD_hash8Ptr(anchor_1,UVar2);
      }
      iVar9 = (int)anchor_1;
      UVar11 = iVar9 - iVar8;
      uVar15 = pUVar4[sVar21];
      uVar3 = pUVar5[local_d70];
      match_1 = pBVar6 + uVar15;
      pBStack_ff8 = pBVar6 + uVar3;
      pUVar5[local_d70] = UVar11;
      pUVar4[sVar21] = UVar11;
      UVar12 = MEM_read32(anchor_1 + (1 - (ulong)offsetSaved_1));
      UVar14 = MEM_read32(anchor_1 + 1);
      if (offsetSaved_1 == 0 || UVar12 != UVar14) {
        if (UVar10 < uVar15) {
          UVar19 = MEM_read64(match_1);
          UVar20 = MEM_read64(anchor_1);
          if (UVar19 != UVar20) goto LAB_00254e0d;
          sVar21 = ZSTD_count(anchor_1 + 8,match_1 + 8,pBVar17);
          lStack_fb0 = sVar21 + 8;
          h2_1._4_4_ = iVar9 - (int)match_1;
          while( true ) {
            bVar26 = false;
            if (_prefixLowestIndex_1 < anchor_1 && pBVar16 < match_1) {
              bVar26 = anchor_1[-1] == match_1[-1];
            }
            if (!bVar26) break;
            anchor_1 = anchor_1 + -1;
            match_1 = match_1 + -1;
            lStack_fb0 = lStack_fb0 + 1;
          }
LAB_00255607:
          local_f40 = offsetSaved_1;
          offsetSaved_1 = h2_1._4_4_;
          uVar25 = (long)anchor_1 - (long)_prefixLowestIndex_1;
          if (pBVar17 + -0x20 < _prefixLowestIndex_1 + uVar25) {
            ZSTD_safecopyLiterals
                      (seqStore->lit,_prefixLowestIndex_1,_prefixLowestIndex_1 + uVar25,
                       pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,_prefixLowestIndex_1);
            if (0x10 < uVar25) {
              pBVar24 = seqStore->lit;
              pBVar23 = pBVar24 + 0x10;
              ZSTD_copy16(pBVar23,_prefixLowestIndex_1 + 0x10);
              if (0x10 < (long)(uVar25 - 0x10)) {
                oend_7 = pBVar24 + 0x20;
                do {
                  op_7 = _prefixLowestIndex_1 + 0x20;
                  ZSTD_copy16(oend_7,op_7);
                  ZSTD_copy16(oend_7 + 0x10,_prefixLowestIndex_1 + 0x30);
                  oend_7 = oend_7 + 0x20;
                  _prefixLowestIndex_1 = op_7;
                } while (oend_7 < pBVar23 + (uVar25 - 0x10));
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar25;
          if (0xffff < uVar25) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar25;
          seqStore->sequences->offset = h2_1._4_4_ + 3;
          if (0xffff < lStack_fb0 - 3U) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(lStack_fb0 - 3U);
          seqStore->sequences = seqStore->sequences + 1;
          goto LAB_002559ba;
        }
LAB_00254e0d:
        if (UVar10 < uVar3) {
          UVar12 = MEM_read32(pBStack_ff8);
          UVar14 = MEM_read32(anchor_1);
          if (UVar12 == UVar14) {
            sVar21 = ZSTD_hash8Ptr(anchor_1 + 1,UVar1);
            ZSTD_hash8Ptr(anchor_1 + 1,UVar1);
            uVar15 = pUVar4[sVar21];
            pBStack_1048 = pBVar6 + uVar15;
            pUVar4[sVar21] = UVar11 + 1;
            if (UVar10 < uVar15) {
              UVar19 = MEM_read64(pBStack_1048);
              UVar20 = MEM_read64(anchor_1 + 1);
              if (UVar19 == UVar20) {
                sVar21 = ZSTD_count(anchor_1 + 9,pBStack_1048 + 8,pBVar17);
                lStack_fb0 = sVar21 + 8;
                anchor_1 = anchor_1 + 1;
                h2_1._4_4_ = (int)anchor_1 - (int)pBStack_1048;
                while( true ) {
                  bVar26 = false;
                  if (_prefixLowestIndex_1 < anchor_1 && pBVar16 < pBStack_1048) {
                    bVar26 = anchor_1[-1] == pBStack_1048[-1];
                  }
                  if (!bVar26) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_1048 = pBStack_1048 + -1;
                  lStack_fb0 = lStack_fb0 + 1;
                }
                goto LAB_00255607;
              }
            }
            sVar21 = ZSTD_count(anchor_1 + 4,pBStack_ff8 + 4,pBVar17);
            lStack_fb0 = sVar21 + 4;
            h2_1._4_4_ = iVar9 - (int)pBStack_ff8;
            while( true ) {
              bVar26 = false;
              if (_prefixLowestIndex_1 < anchor_1 && pBVar16 < pBStack_ff8) {
                bVar26 = anchor_1[-1] == pBStack_ff8[-1];
              }
              if (!bVar26) break;
              anchor_1 = anchor_1 + -1;
              pBStack_ff8 = pBStack_ff8 + -1;
              lStack_fb0 = lStack_fb0 + 1;
            }
            goto LAB_00255607;
          }
        }
        anchor_1 = anchor_1 + ((long)anchor_1 - (long)_prefixLowestIndex_1 >> 8) + 1;
      }
      else {
        sVar21 = ZSTD_count(anchor_1 + 5,anchor_1 + (5 - (ulong)offsetSaved_1),pBVar17);
        lStack_fb0 = sVar21 + 4;
        anchor_1 = anchor_1 + 1;
        uVar25 = (long)anchor_1 - (long)_prefixLowestIndex_1;
        if (pBVar17 + -0x20 < _prefixLowestIndex_1 + uVar25) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixLowestIndex_1,_prefixLowestIndex_1 + uVar25,
                     pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixLowestIndex_1);
          if (0x10 < uVar25) {
            pBVar24 = seqStore->lit;
            pBVar23 = pBVar24 + 0x10;
            ZSTD_copy16(pBVar23,_prefixLowestIndex_1 + 0x10);
            if (0x10 < (long)(uVar25 - 0x10)) {
              oend_6 = pBVar24 + 0x20;
              do {
                op_6 = _prefixLowestIndex_1 + 0x20;
                ZSTD_copy16(oend_6,op_6);
                ZSTD_copy16(oend_6 + 0x10,_prefixLowestIndex_1 + 0x30);
                oend_6 = oend_6 + 0x20;
                _prefixLowestIndex_1 = op_6;
              } while (oend_6 < pBVar23 + (uVar25 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar25;
        if (0xffff < uVar25) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar25;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar21 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar21 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_002559ba:
        _prefixLowestIndex_1 = anchor_1 + lStack_fb0;
        anchor_1 = _prefixLowestIndex_1;
        if (_prefixLowestIndex_1 <= pBVar18) {
          uVar15 = UVar11 + 2;
          sVar21 = ZSTD_hash8Ptr(pBVar6 + uVar15,UVar1);
          pUVar4[sVar21] = uVar15;
          sVar21 = ZSTD_hash8Ptr(_prefixLowestIndex_1 + -2,UVar1);
          pUVar4[sVar21] = (int)(_prefixLowestIndex_1 + -2) - iVar8;
          pBVar24 = pBVar6 + uVar15;
          switch(0x255cb1) {
          case 0:
            local_e18 = ZSTD_hash4Ptr(pBVar24,UVar2);
            break;
          case 1:
            local_e18 = ZSTD_hash5Ptr(pBVar24,UVar2);
            break;
          case 2:
            local_e18 = ZSTD_hash6Ptr(pBVar24,UVar2);
            break;
          case 3:
            local_e18 = ZSTD_hash7Ptr(pBVar24,UVar2);
            break;
          case 4:
            local_e18 = ZSTD_hash8Ptr(pBVar24,UVar2);
          }
          pUVar5[local_e18] = uVar15;
          _prefixLowestIndex_1 = _prefixLowestIndex_1 + -1;
          switch(0x255dc4) {
          case 0:
            local_e30 = ZSTD_hash4Ptr(_prefixLowestIndex_1,UVar2);
            break;
          case 1:
            local_e30 = ZSTD_hash5Ptr(_prefixLowestIndex_1,UVar2);
            break;
          case 2:
            local_e30 = ZSTD_hash6Ptr(_prefixLowestIndex_1,UVar2);
            break;
          case 3:
            local_e30 = ZSTD_hash7Ptr(_prefixLowestIndex_1,UVar2);
            break;
          case 4:
            local_e30 = ZSTD_hash8Ptr(_prefixLowestIndex_1,UVar2);
          }
          pUVar5[local_e30] = (int)_prefixLowestIndex_1 - iVar8;
          while( true ) {
            uVar15 = local_f40;
            bVar26 = false;
            if (anchor_1 <= pBVar18) {
              UVar11 = MEM_read32(anchor_1);
              UVar12 = MEM_read32(anchor_1 + -(ulong)local_f40);
              bVar26 = local_f40 != 0 && UVar11 == UVar12;
            }
            _prefixLowestIndex_1 = anchor_1;
            if (!bVar26) break;
            sVar21 = ZSTD_count(anchor_1 + 4,anchor_1 + 4 + -(ulong)local_f40,pBVar17);
            local_f40 = offsetSaved_1;
            offsetSaved_1 = uVar15;
            switch(0x25671e) {
            case 0:
              local_e78 = ZSTD_hash4Ptr(anchor_1,UVar2);
              break;
            case 1:
              local_e78 = ZSTD_hash5Ptr(anchor_1,UVar2);
              break;
            case 2:
              local_e78 = ZSTD_hash6Ptr(anchor_1,UVar2);
              break;
            case 3:
              local_e78 = ZSTD_hash7Ptr(anchor_1,UVar2);
              break;
            case 4:
              local_e78 = ZSTD_hash8Ptr(anchor_1,UVar2);
            }
            pUVar5[local_e78] = (int)anchor_1 - iVar8;
            sVar22 = ZSTD_hash8Ptr(anchor_1,UVar1);
            pUVar4[sVar22] = (int)anchor_1 - iVar8;
            if (pBVar17 + -0x20 < anchor_1) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_1,anchor_1,pBVar17 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_1);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar21 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar21 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            anchor_1 = anchor_1 + sVar21 + 4;
          }
        }
      }
    }
    if (offsetSaved_1 == 0) {
      local_1af0 = dms_1._4_4_;
    }
    else {
      local_1af0 = offsetSaved_1;
    }
    *rep = local_1af0;
    if (local_f40 == 0) {
      local_1af4 = dms_1._4_4_;
    }
    else {
      local_1af4 = local_f40;
    }
    rep[1] = local_1af4;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_prefixLowestIndex_1);
    break;
  case 6:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar5 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar6 = (ms->window).base;
    iVar8 = (int)pBVar6;
    UVar10 = ZSTD_getLowestPrefixIndex(ms,(iVar7 - iVar8) + iVar9,(ms->cParams).windowLog);
    pBVar16 = pBVar6 + UVar10;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar15 = *rep;
    uVar3 = rep[1];
    dms_2._4_4_ = 0;
    anchor_2 = (BYTE *)((long)src + (long)(int)(uint)(iVar7 == (int)pBVar16));
    UVar11 = (int)anchor_2 - iVar8;
    UVar12 = ZSTD_getLowestPrefixIndex(ms,UVar11,(ms->cParams).windowLog);
    uVar13 = UVar11 - UVar12;
    local_1288 = uVar3;
    if (uVar13 < uVar3) {
      local_1288 = 0;
      dms_2._4_4_ = uVar3;
    }
    offsetSaved_2 = uVar15;
    _prefixLowestIndex_2 = (BYTE *)src;
    if (uVar13 < uVar15) {
      offsetSaved_2 = 0;
      dms_2._4_4_ = uVar15;
    }
    while (anchor_2 < pBVar18) {
      sVar21 = ZSTD_hash8Ptr(anchor_2,UVar1);
      switch(0x257341) {
      case 0:
        local_10b8 = ZSTD_hash4Ptr(anchor_2,UVar2);
        break;
      case 1:
        local_10b8 = ZSTD_hash5Ptr(anchor_2,UVar2);
        break;
      case 2:
        local_10b8 = ZSTD_hash6Ptr(anchor_2,UVar2);
        break;
      case 3:
        local_10b8 = ZSTD_hash7Ptr(anchor_2,UVar2);
        break;
      case 4:
        local_10b8 = ZSTD_hash8Ptr(anchor_2,UVar2);
      }
      ZSTD_hash8Ptr(anchor_2,UVar1);
      switch(0x257511) {
      case 0:
        ZSTD_hash4Ptr(anchor_2,UVar2);
        break;
      case 1:
        ZSTD_hash5Ptr(anchor_2,UVar2);
        break;
      case 2:
        ZSTD_hash6Ptr(anchor_2,UVar2);
        break;
      case 3:
        ZSTD_hash7Ptr(anchor_2,UVar2);
        break;
      case 4:
        ZSTD_hash8Ptr(anchor_2,UVar2);
      }
      iVar9 = (int)anchor_2;
      UVar11 = iVar9 - iVar8;
      uVar15 = pUVar4[sVar21];
      uVar3 = pUVar5[local_10b8];
      match_2 = pBVar6 + uVar15;
      pBStack_1340 = pBVar6 + uVar3;
      pUVar5[local_10b8] = UVar11;
      pUVar4[sVar21] = UVar11;
      UVar12 = MEM_read32(anchor_2 + (1 - (ulong)offsetSaved_2));
      UVar14 = MEM_read32(anchor_2 + 1);
      if (offsetSaved_2 == 0 || UVar12 != UVar14) {
        if (UVar10 < uVar15) {
          UVar19 = MEM_read64(match_2);
          UVar20 = MEM_read64(anchor_2);
          if (UVar19 != UVar20) goto LAB_0025821b;
          sVar21 = ZSTD_count(anchor_2 + 8,match_2 + 8,pBVar17);
          lStack_12f8 = sVar21 + 8;
          h2_2._4_4_ = iVar9 - (int)match_2;
          while( true ) {
            bVar26 = false;
            if (_prefixLowestIndex_2 < anchor_2 && pBVar16 < match_2) {
              bVar26 = anchor_2[-1] == match_2[-1];
            }
            if (!bVar26) break;
            anchor_2 = anchor_2 + -1;
            match_2 = match_2 + -1;
            lStack_12f8 = lStack_12f8 + 1;
          }
LAB_00258a15:
          local_1288 = offsetSaved_2;
          offsetSaved_2 = h2_2._4_4_;
          uVar25 = (long)anchor_2 - (long)_prefixLowestIndex_2;
          if (pBVar17 + -0x20 < _prefixLowestIndex_2 + uVar25) {
            ZSTD_safecopyLiterals
                      (seqStore->lit,_prefixLowestIndex_2,_prefixLowestIndex_2 + uVar25,
                       pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,_prefixLowestIndex_2);
            if (0x10 < uVar25) {
              pBVar24 = seqStore->lit;
              pBVar23 = pBVar24 + 0x10;
              ZSTD_copy16(pBVar23,_prefixLowestIndex_2 + 0x10);
              if (0x10 < (long)(uVar25 - 0x10)) {
                oend_12 = pBVar24 + 0x20;
                do {
                  op_12 = _prefixLowestIndex_2 + 0x20;
                  ZSTD_copy16(oend_12,op_12);
                  ZSTD_copy16(oend_12 + 0x10,_prefixLowestIndex_2 + 0x30);
                  oend_12 = oend_12 + 0x20;
                  _prefixLowestIndex_2 = op_12;
                } while (oend_12 < pBVar23 + (uVar25 - 0x10));
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar25;
          if (0xffff < uVar25) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar25;
          seqStore->sequences->offset = h2_2._4_4_ + 3;
          if (0xffff < lStack_12f8 - 3U) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(lStack_12f8 - 3U);
          seqStore->sequences = seqStore->sequences + 1;
          goto LAB_00258dc8;
        }
LAB_0025821b:
        if (UVar10 < uVar3) {
          UVar12 = MEM_read32(pBStack_1340);
          UVar14 = MEM_read32(anchor_2);
          if (UVar12 == UVar14) {
            sVar21 = ZSTD_hash8Ptr(anchor_2 + 1,UVar1);
            ZSTD_hash8Ptr(anchor_2 + 1,UVar1);
            uVar15 = pUVar4[sVar21];
            pBStack_1390 = pBVar6 + uVar15;
            pUVar4[sVar21] = UVar11 + 1;
            if (UVar10 < uVar15) {
              UVar19 = MEM_read64(pBStack_1390);
              UVar20 = MEM_read64(anchor_2 + 1);
              if (UVar19 == UVar20) {
                sVar21 = ZSTD_count(anchor_2 + 9,pBStack_1390 + 8,pBVar17);
                lStack_12f8 = sVar21 + 8;
                anchor_2 = anchor_2 + 1;
                h2_2._4_4_ = (int)anchor_2 - (int)pBStack_1390;
                while( true ) {
                  bVar26 = false;
                  if (_prefixLowestIndex_2 < anchor_2 && pBVar16 < pBStack_1390) {
                    bVar26 = anchor_2[-1] == pBStack_1390[-1];
                  }
                  if (!bVar26) break;
                  anchor_2 = anchor_2 + -1;
                  pBStack_1390 = pBStack_1390 + -1;
                  lStack_12f8 = lStack_12f8 + 1;
                }
                goto LAB_00258a15;
              }
            }
            sVar21 = ZSTD_count(anchor_2 + 4,pBStack_1340 + 4,pBVar17);
            lStack_12f8 = sVar21 + 4;
            h2_2._4_4_ = iVar9 - (int)pBStack_1340;
            while( true ) {
              bVar26 = false;
              if (_prefixLowestIndex_2 < anchor_2 && pBVar16 < pBStack_1340) {
                bVar26 = anchor_2[-1] == pBStack_1340[-1];
              }
              if (!bVar26) break;
              anchor_2 = anchor_2 + -1;
              pBStack_1340 = pBStack_1340 + -1;
              lStack_12f8 = lStack_12f8 + 1;
            }
            goto LAB_00258a15;
          }
        }
        anchor_2 = anchor_2 + ((long)anchor_2 - (long)_prefixLowestIndex_2 >> 8) + 1;
      }
      else {
        sVar21 = ZSTD_count(anchor_2 + 5,anchor_2 + (5 - (ulong)offsetSaved_2),pBVar17);
        lStack_12f8 = sVar21 + 4;
        anchor_2 = anchor_2 + 1;
        uVar25 = (long)anchor_2 - (long)_prefixLowestIndex_2;
        if (pBVar17 + -0x20 < _prefixLowestIndex_2 + uVar25) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixLowestIndex_2,_prefixLowestIndex_2 + uVar25,
                     pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixLowestIndex_2);
          if (0x10 < uVar25) {
            pBVar24 = seqStore->lit;
            pBVar23 = pBVar24 + 0x10;
            ZSTD_copy16(pBVar23,_prefixLowestIndex_2 + 0x10);
            if (0x10 < (long)(uVar25 - 0x10)) {
              oend_11 = pBVar24 + 0x20;
              do {
                op_11 = _prefixLowestIndex_2 + 0x20;
                ZSTD_copy16(oend_11,op_11);
                ZSTD_copy16(oend_11 + 0x10,_prefixLowestIndex_2 + 0x30);
                oend_11 = oend_11 + 0x20;
                _prefixLowestIndex_2 = op_11;
              } while (oend_11 < pBVar23 + (uVar25 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar25;
        if (0xffff < uVar25) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar25;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar21 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar21 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_00258dc8:
        _prefixLowestIndex_2 = anchor_2 + lStack_12f8;
        anchor_2 = _prefixLowestIndex_2;
        if (_prefixLowestIndex_2 <= pBVar18) {
          uVar15 = UVar11 + 2;
          sVar21 = ZSTD_hash8Ptr(pBVar6 + uVar15,UVar1);
          pUVar4[sVar21] = uVar15;
          sVar21 = ZSTD_hash8Ptr(_prefixLowestIndex_2 + -2,UVar1);
          pUVar4[sVar21] = (int)(_prefixLowestIndex_2 + -2) - iVar8;
          pBVar24 = pBVar6 + uVar15;
          switch(0x2590da) {
          case 0:
            local_1160 = ZSTD_hash4Ptr(pBVar24,UVar2);
            break;
          case 1:
            local_1160 = ZSTD_hash5Ptr(pBVar24,UVar2);
            break;
          case 2:
            local_1160 = ZSTD_hash6Ptr(pBVar24,UVar2);
            break;
          case 3:
            local_1160 = ZSTD_hash7Ptr(pBVar24,UVar2);
            break;
          case 4:
            local_1160 = ZSTD_hash8Ptr(pBVar24,UVar2);
          }
          pUVar5[local_1160] = uVar15;
          _prefixLowestIndex_2 = _prefixLowestIndex_2 + -1;
          switch(0x2591ed) {
          case 0:
            local_1178 = ZSTD_hash4Ptr(_prefixLowestIndex_2,UVar2);
            break;
          case 1:
            local_1178 = ZSTD_hash5Ptr(_prefixLowestIndex_2,UVar2);
            break;
          case 2:
            local_1178 = ZSTD_hash6Ptr(_prefixLowestIndex_2,UVar2);
            break;
          case 3:
            local_1178 = ZSTD_hash7Ptr(_prefixLowestIndex_2,UVar2);
            break;
          case 4:
            local_1178 = ZSTD_hash8Ptr(_prefixLowestIndex_2,UVar2);
          }
          pUVar5[local_1178] = (int)_prefixLowestIndex_2 - iVar8;
          while( true ) {
            uVar15 = local_1288;
            bVar26 = false;
            if (anchor_2 <= pBVar18) {
              UVar11 = MEM_read32(anchor_2);
              UVar12 = MEM_read32(anchor_2 + -(ulong)local_1288);
              bVar26 = local_1288 != 0 && UVar11 == UVar12;
            }
            _prefixLowestIndex_2 = anchor_2;
            if (!bVar26) break;
            sVar21 = ZSTD_count(anchor_2 + 4,anchor_2 + 4 + -(ulong)local_1288,pBVar17);
            local_1288 = offsetSaved_2;
            offsetSaved_2 = uVar15;
            switch(0x259b47) {
            case 0:
              local_11c0 = ZSTD_hash4Ptr(anchor_2,UVar2);
              break;
            case 1:
              local_11c0 = ZSTD_hash5Ptr(anchor_2,UVar2);
              break;
            case 2:
              local_11c0 = ZSTD_hash6Ptr(anchor_2,UVar2);
              break;
            case 3:
              local_11c0 = ZSTD_hash7Ptr(anchor_2,UVar2);
              break;
            case 4:
              local_11c0 = ZSTD_hash8Ptr(anchor_2,UVar2);
            }
            pUVar5[local_11c0] = (int)anchor_2 - iVar8;
            sVar22 = ZSTD_hash8Ptr(anchor_2,UVar1);
            pUVar4[sVar22] = (int)anchor_2 - iVar8;
            if (pBVar17 + -0x20 < anchor_2) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_2,anchor_2,pBVar17 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_2);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar21 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar21 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            anchor_2 = anchor_2 + sVar21 + 4;
          }
        }
      }
    }
    if (offsetSaved_2 == 0) {
      local_1cb8 = dms_2._4_4_;
    }
    else {
      local_1cb8 = offsetSaved_2;
    }
    *rep = local_1cb8;
    if (local_1288 == 0) {
      local_1cbc = dms_2._4_4_;
    }
    else {
      local_1cbc = local_1288;
    }
    rep[1] = local_1cbc;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_prefixLowestIndex_2);
    break;
  case 7:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar5 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar6 = (ms->window).base;
    iVar8 = (int)pBVar6;
    UVar10 = ZSTD_getLowestPrefixIndex(ms,(iVar7 - iVar8) + iVar9,(ms->cParams).windowLog);
    pBVar16 = pBVar6 + UVar10;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar15 = *rep;
    uVar3 = rep[1];
    dms_3._4_4_ = 0;
    anchor_3 = (BYTE *)((long)src + (long)(int)(uint)(iVar7 == (int)pBVar16));
    UVar11 = (int)anchor_3 - iVar8;
    UVar12 = ZSTD_getLowestPrefixIndex(ms,UVar11,(ms->cParams).windowLog);
    uVar13 = UVar11 - UVar12;
    local_15d0 = uVar3;
    if (uVar13 < uVar3) {
      local_15d0 = 0;
      dms_3._4_4_ = uVar3;
    }
    offsetSaved_3 = uVar15;
    _prefixLowestIndex_3 = (BYTE *)src;
    if (uVar13 < uVar15) {
      offsetSaved_3 = 0;
      dms_3._4_4_ = uVar15;
    }
LAB_0025a5c8:
    if (anchor_3 < pBVar18) {
      sVar21 = ZSTD_hash8Ptr(anchor_3,UVar1);
      switch(0x25a76a) {
      case 0:
        local_1400 = ZSTD_hash4Ptr(anchor_3,UVar2);
        break;
      case 1:
        local_1400 = ZSTD_hash5Ptr(anchor_3,UVar2);
        break;
      case 2:
        local_1400 = ZSTD_hash6Ptr(anchor_3,UVar2);
        break;
      case 3:
        local_1400 = ZSTD_hash7Ptr(anchor_3,UVar2);
        break;
      case 4:
        local_1400 = ZSTD_hash8Ptr(anchor_3,UVar2);
      }
      ZSTD_hash8Ptr(anchor_3,UVar1);
      switch(0x25a93a) {
      case 0:
        ZSTD_hash4Ptr(anchor_3,UVar2);
        break;
      case 1:
        ZSTD_hash5Ptr(anchor_3,UVar2);
        break;
      case 2:
        ZSTD_hash6Ptr(anchor_3,UVar2);
        break;
      case 3:
        ZSTD_hash7Ptr(anchor_3,UVar2);
        break;
      case 4:
        ZSTD_hash8Ptr(anchor_3,UVar2);
      }
      iVar9 = (int)anchor_3;
      UVar11 = iVar9 - iVar8;
      uVar15 = pUVar4[sVar21];
      uVar3 = pUVar5[local_1400];
      match_3 = pBVar6 + uVar15;
      pBStack_1688 = pBVar6 + uVar3;
      pUVar5[local_1400] = UVar11;
      pUVar4[sVar21] = UVar11;
      UVar12 = MEM_read32(anchor_3 + (1 - (ulong)offsetSaved_3));
      UVar14 = MEM_read32(anchor_3 + 1);
      if (offsetSaved_3 == 0 || UVar12 != UVar14) {
        if (uVar15 <= UVar10) {
LAB_0025b629:
          if (UVar10 < uVar3) {
            UVar12 = MEM_read32(pBStack_1688);
            UVar14 = MEM_read32(anchor_3);
            if (UVar12 == UVar14) {
              sVar21 = ZSTD_hash8Ptr(anchor_3 + 1,UVar1);
              ZSTD_hash8Ptr(anchor_3 + 1,UVar1);
              uVar15 = pUVar4[sVar21];
              pBStack_16d8 = pBVar6 + uVar15;
              pUVar4[sVar21] = UVar11 + 1;
              if (UVar10 < uVar15) {
                UVar19 = MEM_read64(pBStack_16d8);
                UVar20 = MEM_read64(anchor_3 + 1);
                if (UVar19 == UVar20) {
                  sVar21 = ZSTD_count(anchor_3 + 9,pBStack_16d8 + 8,pBVar17);
                  lStack_1640 = sVar21 + 8;
                  anchor_3 = anchor_3 + 1;
                  h2_3._4_4_ = (int)anchor_3 - (int)pBStack_16d8;
                  while( true ) {
                    bVar26 = false;
                    if (_prefixLowestIndex_3 < anchor_3 && pBVar16 < pBStack_16d8) {
                      bVar26 = anchor_3[-1] == pBStack_16d8[-1];
                    }
                    if (!bVar26) break;
                    anchor_3 = anchor_3 + -1;
                    pBStack_16d8 = pBStack_16d8 + -1;
                    lStack_1640 = lStack_1640 + 1;
                  }
                  goto LAB_0025be23;
                }
              }
              sVar21 = ZSTD_count(anchor_3 + 4,pBStack_1688 + 4,pBVar17);
              lStack_1640 = sVar21 + 4;
              h2_3._4_4_ = iVar9 - (int)pBStack_1688;
              while( true ) {
                bVar26 = false;
                if (_prefixLowestIndex_3 < anchor_3 && pBVar16 < pBStack_1688) {
                  bVar26 = anchor_3[-1] == pBStack_1688[-1];
                }
                if (!bVar26) break;
                anchor_3 = anchor_3 + -1;
                pBStack_1688 = pBStack_1688 + -1;
                lStack_1640 = lStack_1640 + 1;
              }
              goto LAB_0025be23;
            }
          }
          anchor_3 = anchor_3 + ((long)anchor_3 - (long)_prefixLowestIndex_3 >> 8) + 1;
          goto LAB_0025a5c8;
        }
        UVar19 = MEM_read64(match_3);
        UVar20 = MEM_read64(anchor_3);
        if (UVar19 != UVar20) goto LAB_0025b629;
        sVar21 = ZSTD_count(anchor_3 + 8,match_3 + 8,pBVar17);
        lStack_1640 = sVar21 + 8;
        h2_3._4_4_ = iVar9 - (int)match_3;
        while( true ) {
          bVar26 = false;
          if (_prefixLowestIndex_3 < anchor_3 && pBVar16 < match_3) {
            bVar26 = anchor_3[-1] == match_3[-1];
          }
          if (!bVar26) break;
          anchor_3 = anchor_3 + -1;
          match_3 = match_3 + -1;
          lStack_1640 = lStack_1640 + 1;
        }
LAB_0025be23:
        local_15d0 = offsetSaved_3;
        offsetSaved_3 = h2_3._4_4_;
        uVar25 = (long)anchor_3 - (long)_prefixLowestIndex_3;
        if (pBVar17 + -0x20 < _prefixLowestIndex_3 + uVar25) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixLowestIndex_3,_prefixLowestIndex_3 + uVar25,
                     pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixLowestIndex_3);
          if (0x10 < uVar25) {
            pBVar24 = seqStore->lit;
            pBVar23 = pBVar24 + 0x10;
            ZSTD_copy16(pBVar23,_prefixLowestIndex_3 + 0x10);
            if (0x10 < (long)(uVar25 - 0x10)) {
              oend_17 = pBVar24 + 0x20;
              do {
                op_17 = _prefixLowestIndex_3 + 0x20;
                ZSTD_copy16(oend_17,op_17);
                ZSTD_copy16(oend_17 + 0x10,_prefixLowestIndex_3 + 0x30);
                oend_17 = oend_17 + 0x20;
                _prefixLowestIndex_3 = op_17;
              } while (oend_17 < pBVar23 + (uVar25 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar25;
        if (0xffff < uVar25) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar25;
        seqStore->sequences->offset = h2_3._4_4_ + 3;
        if (0xffff < lStack_1640 - 3U) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(lStack_1640 - 3U);
        seqStore->sequences = seqStore->sequences + 1;
      }
      else {
        sVar21 = ZSTD_count(anchor_3 + 5,anchor_3 + (5 - (ulong)offsetSaved_3),pBVar17);
        lStack_1640 = sVar21 + 4;
        anchor_3 = anchor_3 + 1;
        uVar25 = (long)anchor_3 - (long)_prefixLowestIndex_3;
        if (pBVar17 + -0x20 < _prefixLowestIndex_3 + uVar25) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixLowestIndex_3,_prefixLowestIndex_3 + uVar25,
                     pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixLowestIndex_3);
          if (0x10 < uVar25) {
            pBVar24 = seqStore->lit;
            pBVar23 = pBVar24 + 0x10;
            ZSTD_copy16(pBVar23,_prefixLowestIndex_3 + 0x10);
            if (0x10 < (long)(uVar25 - 0x10)) {
              oend_16 = pBVar24 + 0x20;
              do {
                op_16 = _prefixLowestIndex_3 + 0x20;
                ZSTD_copy16(oend_16,op_16);
                ZSTD_copy16(oend_16 + 0x10,_prefixLowestIndex_3 + 0x30);
                oend_16 = oend_16 + 0x20;
                _prefixLowestIndex_3 = op_16;
              } while (oend_16 < pBVar23 + (uVar25 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar25;
        if (0xffff < uVar25) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar25;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar21 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar21 + 1);
        seqStore->sequences = seqStore->sequences + 1;
      }
      _prefixLowestIndex_3 = anchor_3 + lStack_1640;
      anchor_3 = _prefixLowestIndex_3;
      if (_prefixLowestIndex_3 <= pBVar18) {
        uVar15 = UVar11 + 2;
        sVar21 = ZSTD_hash8Ptr(pBVar6 + uVar15,UVar1);
        pUVar4[sVar21] = uVar15;
        sVar21 = ZSTD_hash8Ptr(_prefixLowestIndex_3 + -2,UVar1);
        pUVar4[sVar21] = (int)(_prefixLowestIndex_3 + -2) - iVar8;
        pBVar24 = pBVar6 + uVar15;
        switch(0x25c503) {
        case 0:
          local_14a8 = ZSTD_hash4Ptr(pBVar24,UVar2);
          break;
        case 1:
          local_14a8 = ZSTD_hash5Ptr(pBVar24,UVar2);
          break;
        case 2:
          local_14a8 = ZSTD_hash6Ptr(pBVar24,UVar2);
          break;
        case 3:
          local_14a8 = ZSTD_hash7Ptr(pBVar24,UVar2);
          break;
        case 4:
          local_14a8 = ZSTD_hash8Ptr(pBVar24,UVar2);
        }
        pUVar5[local_14a8] = uVar15;
        _prefixLowestIndex_3 = _prefixLowestIndex_3 + -1;
        switch(0x25c616) {
        case 0:
          local_14c0 = ZSTD_hash4Ptr(_prefixLowestIndex_3,UVar2);
          break;
        case 1:
          local_14c0 = ZSTD_hash5Ptr(_prefixLowestIndex_3,UVar2);
          break;
        case 2:
          local_14c0 = ZSTD_hash6Ptr(_prefixLowestIndex_3,UVar2);
          break;
        case 3:
          local_14c0 = ZSTD_hash7Ptr(_prefixLowestIndex_3,UVar2);
          break;
        case 4:
          local_14c0 = ZSTD_hash8Ptr(_prefixLowestIndex_3,UVar2);
        }
        pUVar5[local_14c0] = (int)_prefixLowestIndex_3 - iVar8;
        while( true ) {
          uVar15 = local_15d0;
          bVar26 = false;
          if (anchor_3 <= pBVar18) {
            UVar11 = MEM_read32(anchor_3);
            UVar12 = MEM_read32(anchor_3 + -(ulong)local_15d0);
            bVar26 = local_15d0 != 0 && UVar11 == UVar12;
          }
          _prefixLowestIndex_3 = anchor_3;
          if (!bVar26) break;
          sVar21 = ZSTD_count(anchor_3 + 4,anchor_3 + 4 + -(ulong)local_15d0,pBVar17);
          local_15d0 = offsetSaved_3;
          offsetSaved_3 = uVar15;
          switch(0x25cf70) {
          case 0:
            local_1508 = ZSTD_hash4Ptr(anchor_3,UVar2);
            break;
          case 1:
            local_1508 = ZSTD_hash5Ptr(anchor_3,UVar2);
            break;
          case 2:
            local_1508 = ZSTD_hash6Ptr(anchor_3,UVar2);
            break;
          case 3:
            local_1508 = ZSTD_hash7Ptr(anchor_3,UVar2);
            break;
          case 4:
            local_1508 = ZSTD_hash8Ptr(anchor_3,UVar2);
          }
          pUVar5[local_1508] = (int)anchor_3 - iVar8;
          sVar22 = ZSTD_hash8Ptr(anchor_3,UVar1);
          pUVar4[sVar22] = (int)anchor_3 - iVar8;
          if (pBVar17 + -0x20 < anchor_3) {
            ZSTD_safecopyLiterals(seqStore->lit,anchor_3,anchor_3,pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,anchor_3);
          }
          seqStore->lit = seqStore->lit;
          seqStore->sequences->litLength = 0;
          seqStore->sequences->offset = 1;
          if (0xffff < sVar21 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(sVar21 + 1);
          seqStore->sequences = seqStore->sequences + 1;
          anchor_3 = anchor_3 + sVar21 + 4;
        }
      }
      goto LAB_0025a5c8;
    }
    if (offsetSaved_3 == 0) {
      local_1e80 = dms_3._4_4_;
    }
    else {
      local_1e80 = offsetSaved_3;
    }
    *rep = local_1e80;
    if (local_15d0 == 0) {
      local_1e84 = dms_3._4_4_;
    }
    else {
      local_1e84 = local_15d0;
    }
    rep[1] = local_1e84;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_prefixLowestIndex_3);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}